

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5HashEntry * fts5HashEntryMerge(Fts5HashEntry *pLeft,Fts5HashEntry *pRight)

{
  byte bVar1;
  byte bVar2;
  Fts5HashEntry **ppFVar3;
  long lVar4;
  Fts5HashEntry *p2;
  Fts5HashEntry *pFVar5;
  Fts5HashEntry *p1;
  Fts5HashEntry *pFVar6;
  Fts5HashEntry *pRet;
  
  pRet = (Fts5HashEntry *)0x0;
  if (pLeft != (Fts5HashEntry *)0x0 || pRight != (Fts5HashEntry *)0x0) {
    ppFVar3 = &pRet;
    do {
      if (pLeft == (Fts5HashEntry *)0x0) {
        *ppFVar3 = pRight;
LAB_001a50ef:
        pFVar5 = (Fts5HashEntry *)0x0;
        pFVar6 = (Fts5HashEntry *)0x0;
      }
      else {
        if (pRight == (Fts5HashEntry *)0x0) {
          *ppFVar3 = pLeft;
          goto LAB_001a50ef;
        }
        lVar4 = 0x30;
        do {
          bVar1 = *(byte *)((long)&pRight->pHashNext + lVar4);
          bVar2 = *(byte *)((long)&pLeft->pHashNext + lVar4);
          lVar4 = lVar4 + 1;
        } while (bVar2 == bVar1);
        if (bVar1 < bVar2) {
          *ppFVar3 = pRight;
          pFVar5 = pRight->pScanNext;
          pFVar6 = pLeft;
          pLeft = pRight;
        }
        else {
          *ppFVar3 = pLeft;
          pFVar6 = pLeft->pScanNext;
          pFVar5 = pRight;
        }
        ppFVar3 = &pLeft->pScanNext;
        *ppFVar3 = (Fts5HashEntry *)0x0;
      }
      pRight = pFVar5;
      pLeft = pFVar6;
    } while (pFVar6 != (Fts5HashEntry *)0x0 || pFVar5 != (Fts5HashEntry *)0x0);
  }
  return pRet;
}

Assistant:

static Fts5HashEntry *fts5HashEntryMerge(
  Fts5HashEntry *pLeft,
  Fts5HashEntry *pRight
){
  Fts5HashEntry *p1 = pLeft;
  Fts5HashEntry *p2 = pRight;
  Fts5HashEntry *pRet = 0;
  Fts5HashEntry **ppOut = &pRet;

  while( p1 || p2 ){
    if( p1==0 ){
      *ppOut = p2;
      p2 = 0;
    }else if( p2==0 ){
      *ppOut = p1;
      p1 = 0;
    }else{
      int i = 0;
      char *zKey1 = fts5EntryKey(p1);
      char *zKey2 = fts5EntryKey(p2);
      while( zKey1[i]==zKey2[i] ) i++;

      if( ((u8)zKey1[i])>((u8)zKey2[i]) ){
        /* p2 is smaller */
        *ppOut = p2;
        ppOut = &p2->pScanNext;
        p2 = p2->pScanNext;
      }else{
        /* p1 is smaller */
        *ppOut = p1;
        ppOut = &p1->pScanNext;
        p1 = p1->pScanNext;
      }
      *ppOut = 0;
    }
  }

  return pRet;
}